

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceULT.cpp
# Opt level: O0

void __thiscall
CTestResource_TestPlanar2D_RGBP_Unaligned_Test::TestBody
          (CTestResource_TestPlanar2D_RGBP_Unaligned_Test *this)

{
  uint32_t uVar1;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  GMM_RESOURCE_INFO *ResourceInfo_00;
  char *pcVar5;
  AssertHelper local_2e0;
  Message local_2d8;
  uint local_2cc;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar_8;
  Message local_2b0;
  uint local_2a4;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar_7;
  Message local_288;
  undefined4 local_27c;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_6;
  GMM_REQ_OFFSET_INFO OffsetInfo;
  Message local_200;
  unsigned_long local_1f8;
  uint local_1ec;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_5;
  Message local_1d0;
  undefined8 local_1c8;
  undefined4 local_1bc;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_4;
  Message local_1a0;
  unsigned_long local_198;
  uint local_18c;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_3;
  Message local_170;
  undefined8 local_168;
  undefined4 local_15c;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_2;
  Message local_140;
  undefined8 local_138;
  undefined4 local_12c;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_1;
  Message local_110 [3];
  undefined8 local_f8;
  undefined4 local_ec;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar;
  uint local_d0;
  uint32_t Size;
  uint32_t Height;
  uint32_t Pitch;
  GMM_RESOURCE_INFO *ResourceInfo;
  GMM_RESCREATE_PARAMS gmmParams;
  TEST_TILE_TYPE Tile;
  uint32_t TileIndex;
  uint32_t TileSize [3] [2];
  uint32_t PlaneRowAlignment;
  TEST_TILE_TYPE TileTypes [3];
  CTestResource_TestPlanar2D_RGBP_Unaligned_Test *this_local;
  
  stack0xffffffffffffffe4 = 0x100000000;
  TileSize[2][0] = 0x10;
  _Tile = 0x100000001;
  TileSize[0][0] = 0x200;
  TileSize[0][1] = 8;
  TileSize[1][0] = 0x80;
  TileSize[1][1] = 0x20;
  for (gmmParams.MultiTileArch.Reserved = 0; gmmParams.MultiTileArch.Reserved < 3;
      gmmParams.MultiTileArch.Reserved = gmmParams.MultiTileArch.Reserved + 1) {
    gmmParams.MultiTileArch._0_4_ = TileSize[2][(ulong)gmmParams.MultiTileArch.Reserved + 1];
    memset(&ResourceInfo,0,0x80);
    ResourceInfo._0_4_ = 2;
    gmmParams.ExistingSysMemSize._4_1_ = 1;
    gmmParams._0_8_ = gmmParams._0_8_ & 0xfffffffbffffffff | 0x400000000;
    gmmParams.CpTag = 0x1e0;
    gmmParams._44_4_ = 0;
    gmmParams.field_6.BaseWidth = 300;
    gmmParams.field_6.BaseWidth64._4_4_ = 1;
    CTestResource::SetTileFlag
              (&this->super_CTestResource,(GMM_RESCREATE_PARAMS *)&ResourceInfo,
               gmmParams.MultiTileArch._0_4_);
    ResourceInfo._4_4_ = 0x168;
    ResourceInfo_00 =
         (GMM_RESOURCE_INFO *)
         (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                   (CommonULT::pGmmULTClientContext,&ResourceInfo);
    uVar1 = gmmParams.CpTag;
    if (gmmParams.MultiTileArch._0_4_ == 0) {
      Size = (uVar1 + 0x3f) - (uVar1 + 0x3f & 0x3f);
      uVar2 = gmmParams.field_6.BaseWidth;
    }
    else {
      Size = (uVar1 + ((&Tile)[(ulong)gmmParams.MultiTileArch.Reserved * 2] - TEST_TILEX)) -
             (uVar1 + ((&Tile)[(ulong)gmmParams.MultiTileArch.Reserved * 2] - TEST_TILEX) &
             (&Tile)[(ulong)gmmParams.MultiTileArch.Reserved * 2] - TEST_TILEX);
      iVar4 = (gmmParams.field_6.BaseWidth + 0xf) - (gmmParams.field_6.BaseWidth + 0xf & 0xf);
      uVar2 = (iVar4 + (TileSize[(ulong)gmmParams.MultiTileArch.Reserved - 1][1] - 1)) -
              (iVar4 + (TileSize[(ulong)gmmParams.MultiTileArch.Reserved - 1][1] - 1) &
              TileSize[(ulong)gmmParams.MultiTileArch.Reserved - 1][1] - 1);
    }
    local_d0 = uVar2 * 3;
    gtest_ar.message_.ptr_._4_4_ = (Size * local_d0 + 0xfff) - (Size * local_d0 + 0xfff & 0xfff);
    CTestResource::VerifyResourcePitch<true>(&this->super_CTestResource,ResourceInfo_00,Size);
    if (gmmParams.MultiTileArch._0_4_ != 0) {
      CTestResource::VerifyResourcePitchInTiles<true>
                (&this->super_CTestResource,ResourceInfo_00,
                 Size / (&Tile)[(ulong)gmmParams.MultiTileArch.Reserved * 2]);
    }
    CTestResource::VerifyResourceSize<true>
              (&this->super_CTestResource,ResourceInfo_00,(ulong)gtest_ar.message_.ptr_._4_4_);
    CTestResource::VerifyResourceHAlign<false>(&this->super_CTestResource,ResourceInfo_00,0);
    CTestResource::VerifyResourceVAlign<false>(&this->super_CTestResource,ResourceInfo_00,0);
    CTestResource::VerifyResourceQPitch<false>(&this->super_CTestResource,ResourceInfo_00,0);
    local_ec = 0;
    local_f8 = (**(code **)(*(long *)ResourceInfo_00 + 0x210))(ResourceInfo_00,1);
    testing::internal::EqHelper<true>::Compare<int,unsigned_long>
              ((char *)local_e8,"0",(int *)"ResourceInfo->GetPlanarXOffset(GMM_PLANE_Y)",
               (unsigned_long *)&local_ec,&local_f8);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
    if (!bVar3) {
      testing::Message::Message(local_110);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0xb95,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(local_110);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
    local_12c = 0;
    local_138 = (**(code **)(*(long *)ResourceInfo_00 + 0x218))(ResourceInfo_00,1);
    testing::internal::EqHelper<true>::Compare<int,unsigned_long>
              ((char *)local_128,"0",(int *)"ResourceInfo->GetPlanarYOffset(GMM_PLANE_Y)",
               (unsigned_long *)&local_12c,&local_138);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
    if (!bVar3) {
      testing::Message::Message(&local_140);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0xb96,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_140);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_140);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
    local_15c = 0;
    local_168 = (**(code **)(*(long *)ResourceInfo_00 + 0x210))(ResourceInfo_00,2);
    testing::internal::EqHelper<true>::Compare<int,unsigned_long>
              ((char *)local_158,"0",(int *)"ResourceInfo->GetPlanarXOffset(GMM_PLANE_U)",
               (unsigned_long *)&local_15c,&local_168);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
    if (!bVar3) {
      testing::Message::Message(&local_170);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0xb99,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_170);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_170);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
    local_18c = local_d0 / 3;
    local_198 = (**(code **)(*(long *)ResourceInfo_00 + 0x218))(ResourceInfo_00,2);
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
              ((EqHelper<false> *)local_188,"Height / 3",
               "ResourceInfo->GetPlanarYOffset(GMM_PLANE_U)",&local_18c,&local_198);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
    if (!bVar3) {
      testing::Message::Message(&local_1a0);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0xb9a,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_1a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_1a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
    local_1bc = 0;
    local_1c8 = (**(code **)(*(long *)ResourceInfo_00 + 0x210))(ResourceInfo_00,3);
    testing::internal::EqHelper<true>::Compare<int,unsigned_long>
              ((char *)local_1b8,"0",(int *)"ResourceInfo->GetPlanarXOffset(GMM_PLANE_V)",
               (unsigned_long *)&local_1bc,&local_1c8);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
    if (!bVar3) {
      testing::Message::Message(&local_1d0);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0xb9d,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1d0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
      testing::Message::~Message(&local_1d0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
    local_1ec = (uint)((ulong)local_d0 * 0xaaaaaaab >> 0x20) & 0xfffffffe;
    local_1f8 = (**(code **)(*(long *)ResourceInfo_00 + 0x218))(ResourceInfo_00,3);
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
              ((EqHelper<false> *)local_1e8,"2 * (Height / 3)",
               "ResourceInfo->GetPlanarYOffset(GMM_PLANE_V)",&local_1ec,&local_1f8);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
    if (!bVar3) {
      testing::Message::Message(&local_200);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&OffsetInfo.StdLayout.TileDepthPitch,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0xb9e,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&OffsetInfo.StdLayout.TileDepthPitch,&local_200);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)&OffsetInfo.StdLayout.TileDepthPitch);
      testing::Message::~Message(&local_200);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
    OffsetInfo.StdLayout.Offset = 0;
    OffsetInfo.StdLayout.TileRowPitch = 0;
    OffsetInfo.Render.XOffset = 0;
    OffsetInfo.Render.YOffset = 0;
    OffsetInfo.Render.ZOffset = 0;
    OffsetInfo.Render._20_4_ = 0;
    OffsetInfo.Lock.Pitch = 0;
    OffsetInfo.Lock.field_2 = (anon_union_4_2_7f1cee3a_for_anon_struct_16_3_bc420dd9_for_Lock_3)0x0;
    OffsetInfo.Render.field_0.Offset64 = 0;
    OffsetInfo.Frame = GMM_DISPLAY_BASE;
    OffsetInfo._28_4_ = 0;
    OffsetInfo.Lock.field_0.Offset64 = 0;
    OffsetInfo.CubeFace = __GMM_CUBE_FACE_POS_X;
    OffsetInfo.Plane = GMM_NO_PLANE;
    gtest_ar_6.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
    OffsetInfo._0_4_ = 0;
    OffsetInfo.ArrayIndex = 0;
    OffsetInfo.MipLevel = 0;
    OffsetInfo.Slice = 1;
    (**(code **)(*(long *)ResourceInfo_00 + 0x68))(ResourceInfo_00,&gtest_ar_6.message_);
    local_27c = 0;
    testing::internal::EqHelper<true>::Compare<int,unsigned_long>
              ((char *)local_278,"0",(int *)"OffsetInfo.Render.Offset64",(unsigned_long *)&local_27c
               ,&OffsetInfo.Lock.Pitch);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
    if (!bVar3) {
      testing::Message::Message(&local_288);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0xba7,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_288);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
      testing::Message::~Message(&local_288);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
    gtest_ar_6.message_.ptr_ = gtest_ar_6.message_.ptr_ | 1;
    OffsetInfo._0_8_ = OffsetInfo._0_8_ & 0xffffffff00000000;
    OffsetInfo.Slice = 2;
    (**(code **)(*(long *)ResourceInfo_00 + 0x68))(ResourceInfo_00,&gtest_ar_6.message_);
    local_2a4 = Size * (local_d0 / 3);
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
              ((EqHelper<false> *)local_2a0,"Pitch * (Height / 3)","OffsetInfo.Render.Offset64",
               &local_2a4,(unsigned_long *)&OffsetInfo.Lock.Pitch);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
    if (!bVar3) {
      testing::Message::Message(&local_2b0);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0xbae,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_2b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
      testing::Message::~Message(&local_2b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
    gtest_ar_6.message_.ptr_ = gtest_ar_6.message_.ptr_ | 1;
    OffsetInfo._0_8_ = OffsetInfo._0_8_ & 0xffffffff00000000;
    OffsetInfo.Slice = 3;
    (**(code **)(*(long *)ResourceInfo_00 + 0x68))(ResourceInfo_00,&gtest_ar_6.message_);
    local_2cc = Size * (local_d0 / 3) * 2;
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
              ((EqHelper<false> *)local_2c8,"2 * Pitch * (Height / 3)","OffsetInfo.Render.Offset64",
               &local_2cc,(unsigned_long *)&OffsetInfo.Lock.Pitch);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
    if (!bVar3) {
      testing::Message::Message(&local_2d8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2c8);
      testing::internal::AssertHelper::AssertHelper
                (&local_2e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0xbb5,pcVar5);
      testing::internal::AssertHelper::operator=(&local_2e0,&local_2d8);
      testing::internal::AssertHelper::~AssertHelper(&local_2e0);
      testing::Message::~Message(&local_2d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))();
  }
  return;
}

Assistant:

TEST_F(CTestResource, TestPlanar2D_RGBP_Unaligned)
{
    /* Test planar surfaces where all planes are full-sized */
    // YYYYYYYY
    // YYYYYYYY
    // YYYYYYYY
    // YYYYYYYY
    // UUUUUUUU
    // UUUUUUUU
    // UUUUUUUU
    // UUUUUUUU
    // VVVVVVVV
    // VVVVVVVV
    // VVVVVVVV
    // VVVVVVVV
    const TEST_TILE_TYPE TileTypes[]       = {TEST_LINEAR, TEST_TILEX, TEST_TILEY};
    const uint32_t       PlaneRowAlignment = 16;

    const uint32_t TileSize[3][2] = {{1, 1},     //Linear
                                     {512, 8},   // TileX
                                     {128, 32}}; // TileY
    for(uint32_t TileIndex = 0; TileIndex < sizeof(TileTypes) / sizeof(TileTypes[0]); TileIndex++)
    {
        TEST_TILE_TYPE Tile = TileTypes[TileIndex];

        GMM_RESCREATE_PARAMS gmmParams = {};
        gmmParams.Type                 = RESOURCE_2D;
        gmmParams.NoGfxMemory          = 1;
        gmmParams.Flags.Gpu.Texture    = 1;
        gmmParams.BaseWidth64          = 480;
        gmmParams.BaseHeight           = 300;
        gmmParams.Depth                = 0x1;
        SetTileFlag(gmmParams, static_cast<TEST_TILE_TYPE>(Tile));
        gmmParams.Format = GMM_FORMAT_RGBP;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        uint32_t Pitch, Height;
        if(Tile != TEST_LINEAR)
        {
            Pitch = GMM_ULT_ALIGN(gmmParams.BaseWidth64, TileSize[TileIndex][0]);
            //Since Tile alignment factor is greater than GMM_IMCx_PLANE_ROW_ALIGNMENT=16
            Height = GMM_ULT_ALIGN(gmmParams.BaseHeight, PlaneRowAlignment);
            Height = GMM_ULT_ALIGN(Height, TileSize[TileIndex][1]) * 3 /*Y, U, V*/;
        }
        else
        {
            Pitch  = GMM_ULT_ALIGN(gmmParams.BaseWidth64, GMM_BYTES(64));
            Height = gmmParams.BaseHeight * 3 /*Y, U, V*/;
        }
        uint32_t Size = GMM_ULT_ALIGN(Pitch * Height, GMM_KBYTE(4));

        VerifyResourcePitch<true>(ResourceInfo, Pitch);
        if(Tile != TEST_LINEAR)
        {
            VerifyResourcePitchInTiles<true>(ResourceInfo, Pitch / TileSize[TileIndex][0]);
        }

        VerifyResourceSize<true>(ResourceInfo, Size);
        VerifyResourceHAlign<false>(ResourceInfo, 0); // Same as any other 2D surface -- tested elsewhere
        VerifyResourceVAlign<false>(ResourceInfo, 0); // Same as any other 2D surface -- tested elsewhere
        VerifyResourceQPitch<false>(ResourceInfo, 0); // N/A for planar

        // Y plane should be at 0,0
        EXPECT_EQ(0, ResourceInfo->GetPlanarXOffset(GMM_PLANE_Y));
        EXPECT_EQ(0, ResourceInfo->GetPlanarYOffset(GMM_PLANE_Y));

        // U plane should be at end of Y plane
        EXPECT_EQ(0, ResourceInfo->GetPlanarXOffset(GMM_PLANE_U));
        EXPECT_EQ(Height / 3, ResourceInfo->GetPlanarYOffset(GMM_PLANE_U));

        // V plane should be at end of U plane
        EXPECT_EQ(0, ResourceInfo->GetPlanarXOffset(GMM_PLANE_V));
        EXPECT_EQ(2 * (Height / 3), ResourceInfo->GetPlanarYOffset(GMM_PLANE_V));

        //Resource Offset
        //Y PLANE
        GMM_REQ_OFFSET_INFO OffsetInfo = {};
        OffsetInfo.ReqRender           = 1;
        OffsetInfo.MipLevel            = 0; //Mip 0
        OffsetInfo.Plane               = GMM_PLANE_Y;
        ResourceInfo->GetOffset(OffsetInfo);
        EXPECT_EQ(0, OffsetInfo.Render.Offset64);

        //U PLANE
        OffsetInfo.ReqRender = 1;
        OffsetInfo.MipLevel  = 0; //Mip 0
        OffsetInfo.Plane     = GMM_PLANE_U;
        ResourceInfo->GetOffset(OffsetInfo);
        EXPECT_EQ(Pitch * (Height / 3), OffsetInfo.Render.Offset64);

        // V PLANE
        OffsetInfo.ReqRender = 1;
        OffsetInfo.MipLevel  = 0; //Mip 0
        OffsetInfo.Plane     = GMM_PLANE_V;
        ResourceInfo->GetOffset(OffsetInfo);
        EXPECT_EQ(2 * Pitch * (Height / 3), OffsetInfo.Render.Offset64);

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}